

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::AddTargetDepend
          (cmComputeTargetDepends *this,int depender_index,cmLinkItem *dependee_name,bool linking)

{
  cmTarget *pcVar1;
  cmake *this_00;
  bool bVar2;
  PolicyStatus PVar3;
  ostream *poVar4;
  cmListFileBacktrace *bt;
  PolicyID id;
  MessageType t;
  string *this_01;
  undefined1 local_208 [32];
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_1e8;
  PositionType local_1e0;
  Snapshot local_1d8;
  string local_1c0;
  ostringstream e;
  
  this_01 = (string *)local_208;
  pcVar1 = dependee_name->Target;
  if (pcVar1 != (cmTarget *)0x0 || linking) {
    if (linking && pcVar1 != (cmTarget *)0x0) {
      if ((pcVar1->TargetTypeValue == EXECUTABLE) &&
         (bVar2 = cmTarget::IsExecutableWithExports(pcVar1), !bVar2)) {
        return;
      }
    }
    else if (pcVar1 == (cmTarget *)0x0) {
      return;
    }
    AddTargetDepend(this,depender_index,pcVar1,linking);
    return;
  }
  pcVar1 = (this->Targets).super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>.
           _M_impl.super__Vector_impl_data._M_start[depender_index];
  if (pcVar1->TargetTypeValue == GLOBAL_TARGET) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  PVar3 = cmTarget::GetPolicyStatusCMP0046(pcVar1);
  if (PVar3 - NEW < 3) {
    t = FATAL_ERROR;
  }
  else {
    if (PVar3 != WARN) goto LAB_0038766c;
    cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_208,(cmPolicies *)0x2e,id);
    poVar4 = std::operator<<((ostream *)&e,(string *)local_208);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)local_208);
    t = AUTHOR_WARNING;
  }
  this_00 = this->GlobalGenerator->CMakeInstance;
  poVar4 = std::operator<<((ostream *)&e,"The dependency target \"");
  poVar4 = std::operator<<(poVar4,(string *)dependee_name);
  poVar4 = std::operator<<(poVar4,"\" of target \"");
  poVar4 = std::operator<<(poVar4,(string *)&pcVar1->Name);
  std::operator<<(poVar4,"\" does not exist.");
  bt = cmTarget::GetUtilityBacktrace(pcVar1,&dependee_name->super_string);
  if (bt == (cmListFileBacktrace *)0x0) {
    std::__cxx11::stringbuf::str();
    cmState::Snapshot::Snapshot(&local_1d8,(cmState *)0x0,(PositionType)ZEXT816(0));
    local_1e0 = local_1d8.Position.Position;
    local_208._24_8_ = local_1d8.State;
    pcStack_1e8 = local_1d8.Position.Tree;
    local_208._0_8_ = (pointer)0x0;
    local_208._8_8_ = (pointer)0x0;
    local_208._16_8_ = 0;
    cmake::IssueMessage(this_00,t,&local_1c0,(cmListFileBacktrace *)local_208);
    std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
              ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_208);
    this_01 = &local_1c0;
  }
  else {
    std::__cxx11::stringbuf::str();
    cmake::IssueMessage(this_00,t,(string *)local_208,bt);
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_0038766c:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return;
}

Assistant:

void cmComputeTargetDepends::AddTargetDepend(
  int depender_index, cmLinkItem const& dependee_name,
  bool linking)
{
  // Get the depender.
  cmTarget const* depender = this->Targets[depender_index];

  // Check the target's makefile first.
  cmTarget const* dependee = dependee_name.Target;

  if(!dependee && !linking &&
    (depender->GetType() != cmTarget::GLOBAL_TARGET))
    {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    bool issueMessage = false;
    std::ostringstream e;
    switch(depender->GetPolicyStatusCMP0046())
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0046) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
      }
    if(issueMessage)
      {
      cmake* cm = this->GlobalGenerator->GetCMakeInstance();

      e << "The dependency target \"" <<  dependee_name
        << "\" of target \"" << depender->GetName() << "\" does not exist.";

      cmListFileBacktrace const* backtrace =
        depender->GetUtilityBacktrace(dependee_name);
      if(backtrace)
        {
        cm->IssueMessage(messageType, e.str(), *backtrace);
        }
      else
        {
        cm->IssueMessage(messageType, e.str());
        }

      }
    }

  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if(linking && dependee &&
     dependee->GetType() == cmTarget::EXECUTABLE &&
     !dependee->IsExecutableWithExports())
    {
    dependee = 0;
    }

  if(dependee)
    {
    this->AddTargetDepend(depender_index, dependee, linking);
    }
}